

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_ref.cpp
# Opt level: O2

MPP_RET mpp_enc_ref_cfg_reset(MppEncRefCfg ref)

{
  MPP_RET MVar1;
  
  MVar1 = _check_is_mpp_enc_ref_cfg("mpp_enc_ref_cfg_reset",ref);
  if (MVar1 == MPP_OK) {
    if (*(void **)((long)ref + 0x28) != (void *)0x0) {
      mpp_osal_free("mpp_enc_ref_cfg_reset",*(void **)((long)ref + 0x28));
    }
    *(undefined8 *)((long)ref + 0x28) = 0;
    if (*(void **)((long)ref + 0x30) != (void *)0x0) {
      mpp_osal_free("mpp_enc_ref_cfg_reset",*(void **)((long)ref + 0x30));
    }
    *(undefined8 *)((long)ref + 0x48) = 0;
    *(undefined8 *)((long)ref + 0x50) = 0;
    *(undefined8 *)((long)ref + 0x38) = 0;
    *(undefined8 *)((long)ref + 0x40) = 0;
    *(undefined8 *)((long)ref + 0x28) = 0;
    *(undefined8 *)((long)ref + 0x30) = 0;
    *(undefined8 *)((long)ref + 0x18) = 0;
    *(undefined8 *)((long)ref + 0x20) = 0;
    *(undefined8 *)((long)ref + 8) = 0;
    *(undefined8 *)((long)ref + 0x10) = 0;
    *(char **)ref = "mpp_enc_ref";
    MVar1 = MPP_OK;
  }
  else {
    MVar1 = MPP_ERR_VALUE;
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_enc_ref_cfg_reset(MppEncRefCfg ref)
{
    if (check_is_mpp_enc_ref_cfg(ref))
        return MPP_ERR_VALUE;

    MppEncRefCfgImpl *p = (MppEncRefCfgImpl *)ref;
    MPP_FREE(p->lt_cfg);
    MPP_FREE(p->st_cfg);
    memset(p, 0, sizeof(*p));
    setup_mpp_enc_ref_cfg(p);

    return MPP_OK;
}